

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int archive_read_support_format_cpio(archive *_a)

{
  int iVar1;
  undefined4 *format_data;
  int iVar2;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_cpio");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    format_data = (undefined4 *)calloc(1,0x50);
    if (format_data == (undefined4 *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate cpio data");
    }
    else {
      *format_data = 0x13141516;
      iVar1 = __archive_read_register_format
                        ((archive_read *)_a,format_data,"cpio",archive_read_format_cpio_bid,
                         archive_read_format_cpio_options,archive_read_format_cpio_read_header,
                         archive_read_format_cpio_read_data,archive_read_format_cpio_skip,
                         (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,
                         archive_read_format_cpio_cleanup,(_func_int_archive_read_ptr *)0x0,
                         (_func_int_archive_read_ptr *)0x0);
      iVar2 = 0;
      if (iVar1 != 0) {
        free(format_data);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_support_format_cpio(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct cpio *cpio;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_cpio");

	cpio = calloc(1, sizeof(*cpio));
	if (cpio == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate cpio data");
		return (ARCHIVE_FATAL);
	}
	cpio->magic = CPIO_MAGIC;

	r = __archive_read_register_format(a,
	    cpio,
	    "cpio",
	    archive_read_format_cpio_bid,
	    archive_read_format_cpio_options,
	    archive_read_format_cpio_read_header,
	    archive_read_format_cpio_read_data,
	    archive_read_format_cpio_skip,
	    NULL,
	    archive_read_format_cpio_cleanup,
	    NULL,
	    NULL);

	if (r != ARCHIVE_OK)
		free(cpio);
	return (ARCHIVE_OK);
}